

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O1

void __thiscall iu_FilePath_x_iutest_x_PrintTo_Test::Body(iu_FilePath_x_iutest_x_PrintTo_Test *this)

{
  FilePath path;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffdc8;
  allocator<char> local_229;
  iuFilePath local_228;
  long *local_208 [2];
  long local_1f8 [2];
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [128];
  ios_base local_110 [264];
  
  iutest::detail::iuFilePath::iuFilePath(&local_228,"test.exe");
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_190 + 0x10),local_228.m_path._M_dataplus._M_p,
             local_228.m_path._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base(local_110);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_1e8,(internal *)"\"test.exe\"","::iutest::PrintToString(path)","test.exe",
             (char *)local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdc8);
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_229);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0xeb;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_path._M_dataplus._M_p != &local_228.m_path.field_2) {
    operator_delete(local_228.m_path._M_dataplus._M_p,
                    local_228.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FilePath, PrintTo)
{
    ::iutest::internal::FilePath path("test.exe");
    IUTEST_ASSERT_STREQ("test.exe", ::iutest::PrintToString(path));
}